

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::ParseForUic
          (cmQtAutoGenerators *this,string *absFilename,string *contentsString,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *this_00;
  string realName;
  string basename;
  string currentUi;
  RegularExpression uiIncludeRegExp;
  string local_50 [32];
  
  if ((this->UicExecutable)._M_string_length != 0) {
    cmsys::RegularExpression::RegularExpression
              (&uiIncludeRegExp,
               "[\n][ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");
    cmsys::SystemTools::GetRealPath(&realName,absFilename,(string *)0x0);
    pcVar2 = strstr((contentsString->_M_dataplus)._M_p,"ui_");
    if (pcVar2 != (char *)0x0) {
      bVar1 = cmsys::RegularExpression::find(&uiIncludeRegExp,contentsString);
      if (bVar1) {
        pcVar2 = (char *)0x0;
        do {
          cmsys::RegularExpression::match_abi_cxx11_(&currentUi,&uiIncludeRegExp,1);
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&basename,&currentUi);
          std::__cxx11::string::substr((ulong)local_50,(ulong)&basename);
          std::__cxx11::string::operator=((string *)&basename,local_50);
          std::__cxx11::string::~string(local_50);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[](includedUis,&realName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_00,&basename);
          pcVar2 = uiIncludeRegExp.endp[0] + ((long)pcVar2 - (long)uiIncludeRegExp.searchstring);
          std::__cxx11::string::~string((string *)&basename);
          std::__cxx11::string::~string((string *)&currentUi);
          bVar1 = cmsys::RegularExpression::find
                            (&uiIncludeRegExp,(contentsString->_M_dataplus)._M_p + (long)pcVar2);
        } while (bVar1);
      }
    }
    std::__cxx11::string::~string((string *)&realName);
    cmsys::RegularExpression::~RegularExpression(&uiIncludeRegExp);
  }
  return;
}

Assistant:

void cmQtAutoGenerators::ParseForUic(const std::string& absFilename,
                const std::string& contentsString,
                std::map<std::string, std::vector<std::string> >& includedUis)
{
  if (this->UicExecutable.empty())
    {
    return;
    }
  cmsys::RegularExpression uiIncludeRegExp(
              "[\n][ \t]*#[ \t]*include[ \t]+"
              "[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");

  std::string::size_type matchOffset = 0;

  const std::string realName =
                   cmsys::SystemTools::GetRealPath(absFilename);

  matchOffset = 0;
  if ((strstr(contentsString.c_str(), "ui_") != NULL)
                                    && (uiIncludeRegExp.find(contentsString)))
    {
    do
      {
      const std::string currentUi = uiIncludeRegExp.match(1);

      std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(currentUi);

      // basename should be the part of the ui filename used for
      // finding the correct header, so we need to remove the ui_ part
      basename = basename.substr(3);

      includedUis[realName].push_back(basename);

      matchOffset += uiIncludeRegExp.end();
      } while(uiIncludeRegExp.find(contentsString.c_str() + matchOffset));
    }
}